

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprp_stmt(lys_ypr_ctx_conflict *pctx,lysp_stmt *stmt)

{
  int8_t flag_00;
  byte bVar1;
  char *pcVar2;
  char *attr_name;
  char *local_58;
  lysp_stmt *plStack_20;
  int8_t flag;
  lysp_stmt *childstmt;
  lysp_stmt *stmt_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  flag_00 = -1;
  if (stmt->child != (lysp_stmt *)0x0) {
    flag_00 = '\x01';
  }
  pcVar2 = lys_stmt_str(stmt->kw);
  if (pcVar2 == (char *)0x0) {
    if (stmt->kw == LY_STMT_EXTENSION_INSTANCE) {
      pcVar2 = stmt->stmt;
      if ((stmt->arg == (char *)0x0) || (*stmt->arg == '\0')) {
        local_58 = (char *)0x0;
      }
      else {
        local_58 = lys_stmt_arg(LY_STMT_VALUE);
      }
      ypr_open(pctx,pcVar2,local_58,stmt->arg,flag_00);
    }
  }
  else {
    bVar1 = lys_stmt_flags(stmt->kw);
    if ((bVar1 & 1) == 0) {
      pcVar2 = stmt->stmt;
      attr_name = lys_stmt_arg(stmt->kw);
      ypr_open(pctx,pcVar2,attr_name,stmt->arg,flag_00);
    }
    else {
      ypr_open(pctx,stmt->stmt,(char *)0x0,(char *)0x0,flag_00);
      pcVar2 = lys_stmt_arg(stmt->kw);
      ypr_yin_arg(pctx,pcVar2,stmt->arg);
    }
  }
  if (stmt->child != (lysp_stmt *)0x0) {
    (pctx->field_0).field_0.level = (pctx->field_0).field_0.level + 1;
    for (plStack_20 = stmt->child; plStack_20 != (lysp_stmt *)0x0; plStack_20 = plStack_20->next) {
      yprp_stmt(pctx,plStack_20);
    }
    (pctx->field_0).field_0.level = (pctx->field_0).field_0.level - 1;
    ypr_close(pctx,stmt->stmt,flag_00);
  }
  return;
}

Assistant:

static void
yprp_stmt(struct lys_ypr_ctx *pctx, struct lysp_stmt *stmt)
{
    struct lysp_stmt *childstmt;
    uint16_t tflags = 0;

    if (stmt->arg) {
        if (stmt->flags) {
            if (stmt->flags & LYS_SINGLEQUOTED) {
                tflags |= LYS_YPR_TEXT_SINGLEQUOTED;
            }
            ypr_text(pctx, stmt->stmt, stmt->arg, tflags);
            ly_print_(pctx->out, "%s", stmt->child ? " {\n" : ";\n");
        } else {
            ly_print_(pctx->out, "%*s%s %s%s", INDENT, stmt->stmt, stmt->arg, stmt->child ? " {\n" : ";\n");
        }
    } else {
        ly_print_(pctx->out, "%*s%s%s", INDENT, stmt->stmt, stmt->child ? " {\n" : ";\n");
    }

    if (stmt->child) {
        LEVEL++;
        LY_LIST_FOR(stmt->child, childstmt) {
            yprp_stmt(pctx, childstmt);
        }
        LEVEL--;
        ly_print_(pctx->out, "%*s}\n", INDENT);
    }
}